

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVLD4DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  DecodeStatus DVar2;
  byte bVar3;
  uint uVar4;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t Address_03;
  uint64_t extraout_RDX;
  uint64_t Address_04;
  uint64_t Address_05;
  uint uVar6;
  ulong Val;
  int iVar7;
  void *pvVar5;
  
  uVar4 = Insn >> 6 & 3;
  pvVar5 = (void *)(ulong)uVar4;
  iVar7 = ((Insn >> 5 & 1) != 0) + 1;
  uVar6 = Insn >> 4 & 1;
  if (uVar4 == 2) {
    Val = (ulong)(uVar6 << 3);
  }
  else if (uVar4 == 3) {
    if (uVar6 == 0) {
      return MCDisassembler_Fail;
    }
    Val = 0x10;
  }
  else {
    bVar3 = (char)uVar4 + 2;
    pvVar5 = (void *)(ulong)bVar3;
    Val = (ulong)(uVar6 << bVar3);
  }
  uVar4 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  DVar1 = DecodeDPRRegisterClass(Inst,uVar4,Address,pvVar5);
  pvVar5 = (void *)(ulong)(DVar1 | 2);
  if ((DVar1 | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  DVar2 = DecodeDPRRegisterClass(Inst,uVar4 + iVar7 & 0x1f,Address_00,pvVar5);
  if (DVar2 == MCDisassembler_Success) {
LAB_00153074:
    DVar2 = DecodeDPRRegisterClass(Inst,uVar4 + iVar7 * 2 & 0x1f,Address_01,pvVar5);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_0015311b;
      DVar1 = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeDPRRegisterClass(Inst,iVar7 * 3 + uVar4 & 0x1f,Address_02,pvVar5);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar1 = MCDisassembler_SoftFail;
    }
    uVar6 = Insn >> 0x10 & 0xf;
    uVar4 = Insn & 0xf;
    Address_04 = Address_03;
    if ((uVar4 != 0xf) &&
       (DVar2 = DecodeGPRRegisterClass(Inst,uVar6,Address_03,pvVar5), Address_04 = extraout_RDX,
       DVar2 != MCDisassembler_Success)) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_0015311b;
      DVar1 = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeGPRRegisterClass(Inst,uVar6,Address_04,pvVar5);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_0015311b;
      DVar1 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,Val);
    if (uVar4 == 0xd) {
      MCOperand_CreateReg0(Inst,0);
    }
    else if (((uVar4 != 0xf) &&
             (DVar2 = DecodeGPRRegisterClass(Inst,uVar4,Address_05,pvVar5),
             DVar2 != MCDisassembler_Success)) &&
            (DVar1 = MCDisassembler_Fail, DVar2 == MCDisassembler_SoftFail)) {
      DVar1 = MCDisassembler_SoftFail;
    }
  }
  else {
    if (DVar2 == MCDisassembler_SoftFail) {
      DVar1 = MCDisassembler_SoftFail;
      goto LAB_00153074;
    }
LAB_0015311b:
    DVar1 = MCDisassembler_Fail;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeVLD4DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, size, inc, align;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	size = fieldFromInstruction_4(Insn, 6, 2);
	inc = fieldFromInstruction_4(Insn, 5, 1) + 1;
	align = fieldFromInstruction_4(Insn, 4, 1);

	if (size == 0x3) {
		if (align == 0)
			return MCDisassembler_Fail;
		align = 16;
	} else {
		if (size == 2) {
			align *= 8;
		} else {
			size = 1 << size;
			align *= 4 * size;
		}
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	if (Rm == 0xD)
		MCOperand_CreateReg0(Inst, 0);
	else if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}